

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O3

void __thiscall OpenMD::NameFinder::NameFinder(NameFinder *this,SimInfo *info)

{
  vector<int,_std::allocator<int>_> *this_00;
  SimInfo *pSVar1;
  int *piVar2;
  iterator iVar3;
  int local_1c;
  
  this->info_ = info;
  this_00 = &this->nObjects_;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->root_).super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1c = info->nGlobalRigidBodies_ + info->nGlobalAtoms_;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,(iterator)0x0,&local_1c);
  pSVar1 = this->info_;
  iVar3._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1c = pSVar1->nGlobalBonds_;
  piVar2 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar3,&local_1c);
    pSVar1 = this->info_;
    iVar3._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = local_1c;
    iVar3._M_current = iVar3._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current;
  }
  local_1c = pSVar1->nGlobalBends_;
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar3,&local_1c);
    pSVar1 = this->info_;
    iVar3._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = local_1c;
    iVar3._M_current = iVar3._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current;
  }
  local_1c = pSVar1->nGlobalTorsions_;
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar3,&local_1c);
    pSVar1 = this->info_;
    iVar3._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = local_1c;
    iVar3._M_current = iVar3._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current;
  }
  local_1c = pSVar1->nGlobalInversions_;
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar3,&local_1c);
    pSVar1 = this->info_;
    iVar3._M_current =
         (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = local_1c;
    iVar3._M_current = iVar3._M_current + 1;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current;
  }
  local_1c = pSVar1->nGlobalMols_;
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar3,&local_1c);
  }
  else {
    *iVar3._M_current = local_1c;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  loadNames(this);
  return;
}

Assistant:

NameFinder::NameFinder(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    loadNames();
  }